

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

Matrix * __thiscall Matrix::transpose(Matrix *this)

{
  pointer pvVar1;
  pointer pdVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  pointer pvVar7;
  ulong uVar8;
  Matrix transposed;
  Matrix local_28;
  
  Matrix(&local_28,(this->m_shape).field_0.m_dims[1],(this->m_shape).field_0.m_dims[0]);
  uVar6 = (this->m_shape).field_0.m_dims[1];
  if (uVar6 != 0) {
    pvVar1 = (this->m_vals).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (ulong)(this->m_shape).field_0.m_dims[0];
    uVar3 = 0;
    do {
      iVar4 = (int)uVar5;
      uVar5 = 0;
      if (iVar4 != 0) {
        pdVar2 = local_28.m_vals.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar3].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar8 = 0;
        pvVar7 = pvVar1;
        do {
          pdVar2[uVar8] =
               *(double *)
                (*(long *)&(pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl +
                uVar3 * 8);
          uVar8 = uVar8 + 1;
          uVar5 = (ulong)(this->m_shape).field_0.m_dims[0];
          pvVar7 = pvVar7 + 1;
        } while (uVar8 < uVar5);
        uVar6 = (this->m_shape).field_0.m_dims[1];
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar6);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&this->m_vals,&local_28.m_vals);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_28.m_vals);
  return this;
}

Assistant:

Matrix& Matrix::transpose(){
    Matrix transposed(m_shape.n_col, m_shape.n_row);
    // double tmp;

    for(uint i=0;i<m_shape.n_col;++i){
        for(uint j=0;j<m_shape.n_row;++j){
            // tmp=m_vals[i][j];
            transposed.m_vals[i][j]=m_vals[j][i];
        }
    }
    m_vals=transposed.m_vals;

    return *this;
}